

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall JsonParser_serialize_map_Test::TestBody(JsonParser_serialize_map_Test *this)

{
  allocator<char8_t> *this_00;
  bool bVar1;
  object *poVar2;
  char *pcVar3;
  AssertHelper local_150 [8];
  Message local_148 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  u8string local_108 [39];
  allocator<char8_t> local_e1;
  u8string local_e0 [39];
  allocator<char8_t> local_b9;
  u8string local_b8 [32];
  int local_98 [5];
  allocator<char8_t> local_81;
  u8string local_80 [39];
  bool local_59;
  undefined1 local_58 [8];
  object obj;
  json_parser parser;
  JsonParser_serialize_map_Test *this_local;
  
  jessilib::json_parser::json_parser
            ((json_parser *)
             ((long)&obj.m_value.
                     super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                     .
                     super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                     .
                     super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                     .
                     super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                     .
                     super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
             + 0x38));
  jessilib::object::object((object *)local_58);
  local_59 = true;
  std::allocator<char8_t>::allocator(&local_81);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_80,"some_bool",&local_81);
  poVar2 = (object *)jessilib::object::operator[]((u8string *)local_58);
  jessilib::object::operator=<bool,_nullptr>(poVar2,&local_59);
  std::__cxx11::u8string::~u8string(local_80);
  std::allocator<char8_t>::~allocator(&local_81);
  local_98[0] = 0x4d2;
  std::allocator<char8_t>::allocator(&local_b9);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_b8,"some_int",&local_b9);
  poVar2 = (object *)jessilib::object::operator[]((u8string *)local_58);
  jessilib::object::operator=<int,_nullptr>(poVar2,local_98);
  std::__cxx11::u8string::~u8string(local_b8);
  std::allocator<char8_t>::~allocator(&local_b9);
  std::allocator<char8_t>::allocator(&local_e1);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_e0,"some_string",&local_e1);
  poVar2 = (object *)jessilib::object::operator[]((u8string *)local_58);
  jessilib::object::operator=<const_char8_t_(&)[5],_nullptr>(poVar2,(char8_t (*) [5])0x692482);
  std::__cxx11::u8string::~u8string(local_e0);
  std::allocator<char8_t>::~allocator(&local_e1);
  this_00 = (allocator<char8_t> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<char8_t>::allocator(this_00);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_108,"some_null",this_00);
  jessilib::object::operator[]((u8string *)local_58);
  std::__cxx11::u8string::~u8string(local_108);
  std::allocator<char8_t>::~allocator
            ((allocator<char8_t> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  jessilib::parser::serialize<char8_t>
            (&local_140,
             (parser *)
             ((long)&obj.m_value.
                     super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                     .
                     super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                     .
                     super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                     .
                     super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                     .
                     super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
             + 0x38),(object *)local_58);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[73],_nullptr>
            ((EqHelper *)local_120,"parser.serialize<char8_t>(obj)",
             "u8R\"json({\"some_bool\":true,\"some_int\":1234,\"some_null\":null,\"some_string\":\"text\"})json\""
             ,&local_140,
             (char8_t (*) [73])
             "{\"some_bool\":true,\"some_int\":1234,\"some_null\":null,\"some_string\":\"text\"}");
  std::__cxx11::u8string::~u8string((u8string *)&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(local_150);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(JsonParser, serialize_map) {
	json_parser parser;
	object obj;

	obj[u8"some_bool"] = true;
	obj[u8"some_int"] = 1234;
	obj[u8"some_string"] = u8"text";
	obj[u8"some_null"];

	EXPECT_EQ(parser.serialize<char8_t>(obj),
		u8R"json({"some_bool":true,"some_int":1234,"some_null":null,"some_string":"text"})json");
}